

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

LY_ERR lyb_print_node_opaq(ly_out *out,lyd_node_opaq *opaq,lyd_lyb_ctx *lyd_lybctx)

{
  lylyb_ctx *lybctx_00;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lylyb_ctx *lybctx;
  lyd_lyb_ctx *lyd_lybctx_local;
  lyd_node_opaq *opaq_local;
  ly_out *out_local;
  
  lybctx_00 = lyd_lybctx->lybctx;
  out_local._4_4_ = lyb_print_attributes(out,opaq,lybctx_00);
  if ((((((out_local._4_4_ == LY_SUCCESS) &&
         (out_local._4_4_ = lyb_write_number((ulong)(opaq->field_0).node.flags,4,out,lybctx_00),
         out_local._4_4_ == LY_SUCCESS)) &&
        (out_local._4_4_ = lyb_write_string((opaq->name).prefix,0,'\x02',out,lybctx_00),
        out_local._4_4_ == LY_SUCCESS)) &&
       ((out_local._4_4_ = lyb_write_string((opaq->name).field_2.module_ns,0,'\x02',out,lybctx_00),
        out_local._4_4_ == LY_SUCCESS &&
        (out_local._4_4_ = lyb_write_string((opaq->name).name,0,'\x02',out,lybctx_00),
        out_local._4_4_ == LY_SUCCESS)))) &&
      ((out_local._4_4_ = lyb_write_string(opaq->value,0,'\b',out,lybctx_00),
       out_local._4_4_ == LY_SUCCESS &&
       ((out_local._4_4_ = lyb_write_number((ulong)opaq->format,1,out,lybctx_00),
        out_local._4_4_ == LY_SUCCESS &&
        (out_local._4_4_ = lyb_print_prefix_data(out,opaq->format,opaq->val_prefix_data,lybctx_00),
        out_local._4_4_ == LY_SUCCESS)))))) &&
     (out_local._4_4_ = lyb_print_siblings(out,opaq->child,lyd_lybctx),
     out_local._4_4_ == LY_SUCCESS)) {
    out_local._4_4_ = LY_SUCCESS;
  }
  return out_local._4_4_;
}

Assistant:

static LY_ERR
lyb_print_node_opaq(struct ly_out *out, const struct lyd_node_opaq *opaq, struct lyd_lyb_ctx *lyd_lybctx)
{
    struct lylyb_ctx *lybctx = lyd_lybctx->lybctx;

    /* write attributes */
    LY_CHECK_RET(lyb_print_attributes(out, opaq, lybctx));

    /* write node flags */
    LY_CHECK_RET(lyb_write_number(opaq->flags, sizeof opaq->flags, out, lybctx));

    /* prefix */
    LY_CHECK_RET(lyb_write_string(opaq->name.prefix, 0, sizeof(uint16_t), out, lybctx));

    /* module reference */
    LY_CHECK_RET(lyb_write_string(opaq->name.module_name, 0, sizeof(uint16_t), out, lybctx));

    /* name */
    LY_CHECK_RET(lyb_write_string(opaq->name.name, 0, sizeof(uint16_t), out, lybctx));

    /* value */
    LY_CHECK_RET(lyb_write_string(opaq->value, 0, sizeof(uint64_t), out, lybctx));

    /* format */
    LY_CHECK_RET(lyb_write_number(opaq->format, 1, out, lybctx));

    /* value prefixes */
    LY_CHECK_RET(lyb_print_prefix_data(out, opaq->format, opaq->val_prefix_data, lybctx));

    /* recursively write all the descendants */
    LY_CHECK_RET(lyb_print_siblings(out, opaq->child, lyd_lybctx));

    return LY_SUCCESS;
}